

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist.h
# Opt level: O3

Node * __thiscall
leveldb::SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::FindLessThan
          (SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *this,char **key)

{
  int iVar1;
  Node *pNVar2;
  uint uVar3;
  Node *pNVar4;
  Node *pNVar5;
  
  pNVar2 = this->head_;
  uVar3 = *(int *)&(this->max_height_).rep_ - 1;
  pNVar4 = pNVar2;
  while ((pNVar4 == pNVar2 ||
         (iVar1 = MemTable::KeyComparator::operator()(&this->compare_,pNVar4->key,*key), iVar1 < 0))
        ) {
    if ((int)uVar3 < 0) {
      __assert_fail("n >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/plutolove[P]leveldb/db/skiplist.h"
                    ,0xa0,
                    "Node *leveldb::SkipList<const char *, leveldb::MemTable::KeyComparator>::Node::Next(int) [Key = const char *, Comparator = leveldb::MemTable::KeyComparator]"
                   );
    }
    pNVar5 = (Node *)pNVar4->next_[uVar3].rep_;
    if ((pNVar5 == (Node *)0x0) ||
       (iVar1 = MemTable::KeyComparator::operator()(&this->compare_,pNVar5->key,*key), -1 < iVar1))
    {
      if (uVar3 == 0) {
        return pNVar4;
      }
      uVar3 = uVar3 - 1;
      pNVar5 = pNVar4;
    }
    pNVar2 = this->head_;
    pNVar4 = pNVar5;
  }
  __assert_fail("x == head_ || compare_(x->key, key) < 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/plutolove[P]leveldb/db/skiplist.h"
                ,0x128,
                "typename SkipList<Key, Comparator>::Node *leveldb::SkipList<const char *, leveldb::MemTable::KeyComparator>::FindLessThan(const Key &) const [Key = const char *, Comparator = leveldb::MemTable::KeyComparator]"
               );
}

Assistant:

typename SkipList<Key, Comparator>::Node *
    SkipList<Key, Comparator>::FindLessThan(const Key &key) const {
        Node *x = head_;
        int level = GetMaxHeight() - 1;
        while (true) {
            assert(x == head_ || compare_(x->key, key) < 0);
            Node *next = x->Next(level);
            if (next == NULL || compare_(next->key, key) >= 0) {
                if (level == 0) {
                    return x;
                } else {
                    // Switch to next list
                    level--;
                }
            } else {
                x = next;
            }
        }
    }